

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

void * dec_vproc_thread(void *data)

{
  RK_U32 RVar1;
  MppThreadStatus MVar2;
  MPP_RET MVar3;
  RK_U32 RVar4;
  RK_U32 RVar5;
  RK_U32 RVar6;
  RK_U32 RVar7;
  Mutex *mutex;
  MppBuffer buffer;
  void *pvVar8;
  RK_U32 local_11c;
  size_t sStack_118;
  RK_S32 tmp;
  size_t buf_size;
  MppBuffer buf;
  MppFrame frm;
  RK_U32 change;
  RK_U32 eos;
  RK_S32 index;
  AutoMutex autolock;
  MPP_RET ret;
  HalDecVprocTask *task_vproc;
  HalTaskInfo task_info;
  HalTaskHnd task;
  MppBufSlots slots;
  MppDecImpl *dec;
  Mpp *mpp;
  MppThread *thd;
  HalTaskGroup tasks;
  MppDecVprocCtxImpl *ctx;
  void *data_local;
  
  thd = *(MppThread **)((long)data + 8);
  mpp = *(Mpp **)((long)data + 0x18);
  dec = *data;
  slots = *(MppBufSlots *)&(dec->cfg).base.fast_parse;
  task = *(HalTaskHnd *)((long)slots + 0x30);
  task_info._120_8_ = 0;
  tasks = data;
  ctx = (MppDecVprocCtxImpl *)data;
  if ((mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread started\n",(char *)0x0);
  }
LAB_0019e78f:
  do {
    do {
      while( true ) {
        autolock.mLock._4_4_ = 0;
        mutex = MppThread::mutex((MppThread *)mpp,THREAD_WORK);
        Mutex::Autolock::Autolock((Autolock *)&index,mutex,1);
        MVar2 = MppThread::get_status((MppThread *)mpp,THREAD_WORK);
        if (MVar2 == MPP_THREAD_RUNNING) {
          if ((*(int *)((long)tasks + 0x90) != 0) && (*(int *)((long)tasks + 0x20) == 0)) {
            if ((vproc_debug & 2) != 0) {
              _mpp_log_l(4,"mpp_dec_vproc","vproc thread wait %d","dec_vproc_thread");
            }
            MppThread::wait((MppThread *)mpp,(void *)0x0);
          }
          eos = 0;
        }
        else {
          eos = 5;
        }
        Mutex::Autolock::~Autolock((Autolock *)&index);
        if (eos != 0) {
          if ((mpp_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","mpp_dec_post_proc_thread exited\n",(char *)0x0);
          }
          return (void *)0x0;
        }
        if ((*(byte *)((long)tasks + 0x8c) & 1) != 0) break;
        MVar3 = hal_task_get_hnd(thd,1,(HalTaskHnd *)(task_info.dec.refer + 0x10));
        if (MVar3 == MPP_OK) {
          *(byte *)((long)tasks + 0x8c) = *(byte *)((long)tasks + 0x8c) & 0xfe | 1;
          *(byte *)((long)tasks + 0x90) = *(byte *)((long)tasks + 0x90) & 0xfe;
          break;
        }
        if (*(int *)((long)tasks + 0x20) == 0) {
          *(byte *)((long)tasks + 0x90) = *(byte *)((long)tasks + 0x90) & 0xfe | 1;
        }
        else {
          if ((vproc_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","reset start\n","dec_vproc_thread");
          }
          dec_vproc_clr_prev((MppDecVprocCtxImpl *)tasks);
          MppThread::lock((MppThread *)mpp,THREAD_CONTROL);
          *(undefined4 *)((long)tasks + 0x20) = 0;
          MppThread::unlock((MppThread *)mpp,THREAD_CONTROL);
          sem_post((sem_t *)((long)tasks + 0x28));
          *(undefined4 *)((long)tasks + 0x90) = 0;
          if ((vproc_debug & 4) != 0) {
            _mpp_log_l(4,"mpp_dec_vproc","reset done\n","dec_vproc_thread");
          }
        }
      }
    } while (task_info._120_8_ == 0);
    autolock.mLock._4_4_ = hal_task_hnd_get_info((HalTaskHnd)task_info._120_8_,&task_vproc);
    if ((autolock.mLock._4_4_ != MPP_OK) &&
       (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
                   "dec_vproc_thread",0x377), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    change = task_vproc._4_4_;
    frm._4_4_ = (uint)((byte)task_vproc & 1);
    frm._0_4_ = (uint)((byte)task_vproc >> 1 & 1);
    buf = (MppBuffer)0x0;
    if ((frm._4_4_ == 0) || (-1 < (int)task_vproc._4_4_)) {
      mpp_buf_slot_get_prop(task,task_vproc._4_4_,SLOT_FRAME_PTR,&buf);
      if ((uint)frm == 0) {
        if ((vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","vproc get buf in","dec_vproc_thread");
        }
        if (((*(byte *)((long)tasks + 0x8c) >> 1 & 1) == 0) && (*(int *)((long)tasks + 0x20) == 0))
        {
          buf_size = (size_t)mpp_frame_get_buffer(buf);
          sStack_118 = mpp_buffer_get_size_with_caller((MppBuffer)buf_size,"dec_vproc_thread");
          if (*(long *)((long)tasks + 0xb8) == 0) {
            mpp_buffer_get_with_tag
                      ((dec->dec_cb).callBack,(MppBuffer *)((long)tasks + 0xb8),sStack_118,
                       "mpp_dec_vproc","dec_vproc_thread");
            if ((vproc_debug & 0x80) != 0) {
              mpp_buffer_get_ptr_with_caller(*(MppBuffer *)((long)tasks + 0xb8),"dec_vproc_thread");
              _mpp_log_l(4,"mpp_dec_vproc","get out buf0 ptr %p\n","dec_vproc_thread");
            }
            if (*(long *)((long)tasks + 0xb8) == 0) {
              *(byte *)((long)tasks + 0x90) = *(byte *)((long)tasks + 0x90) & 0xfd | 2;
              goto LAB_0019e78f;
            }
          }
          if (*(long *)((long)tasks + 0xc0) == 0) {
            mpp_buffer_get_with_tag
                      ((dec->dec_cb).callBack,(MppBuffer *)((long)tasks + 0xc0),sStack_118,
                       "mpp_dec_vproc","dec_vproc_thread");
            if ((vproc_debug & 0x80) != 0) {
              mpp_buffer_get_ptr_with_caller(*(MppBuffer *)((long)tasks + 0xc0),"dec_vproc_thread");
              _mpp_log_l(4,"mpp_dec_vproc","get out buf1 ptr %p\n","dec_vproc_thread");
            }
            if (*(long *)((long)tasks + 0xc0) == 0) {
              *(byte *)((long)tasks + 0x90) = *(byte *)((long)tasks + 0x90) & 0xfd | 2;
              goto LAB_0019e78f;
            }
          }
          *(byte *)((long)tasks + 0x8c) = *(byte *)((long)tasks + 0x8c) & 0xfd | 2;
        }
        local_11c = 0xffffffff;
        mpp_buf_slot_dequeue(task,(RK_S32 *)&local_11c,QUEUE_DEINTERLACE);
        if ((local_11c != change) &&
           (_mpp_log_l(2,"mpp_dec_vproc","Assertion %s failed at %s:%d\n",(char *)0x0,"tmp == index"
                       ,"dec_vproc_thread",0x3b5), (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if ((vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","vproc get buf ready & start process ","dec_vproc_thread");
        }
        if ((*(int *)((long)tasks + 0x20) == 0) && (*(long *)((long)tasks + 0x48) != 0)) {
          if ((vproc_debug & 0x40) != 0) {
            RVar4 = mpp_frame_get_poc(buf);
            RVar5 = mpp_frame_get_mode(buf);
            RVar6 = mpp_frame_get_errinfo(buf);
            RVar7 = mpp_frame_get_discard(buf);
            RVar1 = change;
            buffer = mpp_frame_get_buffer(buf);
            pvVar8 = mpp_buffer_get_ptr_with_caller(buffer,"dec_vproc_thread");
            _mpp_log_l(4,"mpp_dec_vproc",
                       "processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n",
                       "dec_vproc_thread",(ulong)RVar4,(ulong)RVar5,RVar6,RVar7,RVar1,pvVar8);
          }
          (**(code **)((long)tasks + 0xd0))(tasks,buf);
        }
        dec_vproc_update_ref((MppDecVprocCtxImpl *)tasks,buf,change,frm._4_4_);
        hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,0);
        *(undefined4 *)((long)tasks + 0x8c) = 0;
        *(undefined4 *)((long)tasks + 0x90) = 0;
        if ((vproc_debug & 2) != 0) {
          _mpp_log_l(4,"mpp_dec_vproc","vproc task done","dec_vproc_thread");
        }
        goto LAB_0019e78f;
      }
      if ((vproc_debug & 2) != 0) {
        _mpp_log_l(4,"mpp_dec_vproc","info change\n","dec_vproc_thread");
      }
      if ((vproc_debug & 0x80) != 0) {
        mpp_frame_get_poc(buf);
        _mpp_log_l(4,"mpp_dec_vproc","output at info change, frame poc %d\n","dec_vproc_thread");
      }
      dec_vproc_put_frame((Mpp *)dec,buf,(MppBuffer)0x0,-1,0);
      dec_vproc_clr_prev((MppDecVprocCtxImpl *)tasks);
      if (*(long *)(**(long **)((long)tasks + 0x50) + 0x18) != 0) {
        (**(code **)(**(long **)((long)tasks + 0x50) + 0x18))(*(undefined8 *)((long)tasks + 0x48));
      }
      hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,0);
      *(byte *)((long)tasks + 0x8c) = *(byte *)((long)tasks + 0x8c) & 0xfe;
      goto LAB_0019e78f;
    }
    if ((vproc_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_dec_vproc","eos signal\n","dec_vproc_thread");
    }
    mpp_frame_init(&buf);
    mpp_frame_set_eos(buf,frm._4_4_);
    if ((vproc_debug & 0x80) != 0) {
      mpp_frame_get_poc(buf);
      _mpp_log_l(4,"mpp_dec_vproc","output at eos, frame poc %d\n","dec_vproc_thread");
    }
    dec_vproc_put_frame((Mpp *)dec,buf,(MppBuffer)0x0,-1,0);
    dec_vproc_clr_prev((MppDecVprocCtxImpl *)tasks);
    mpp_frame_deinit(&buf);
    hal_task_hnd_set_status((HalTaskHnd)task_info._120_8_,0);
    *(byte *)((long)tasks + 0x8c) = *(byte *)((long)tasks + 0x8c) & 0xfe;
  } while( true );
}

Assistant:

static void *dec_vproc_thread(void *data)
{
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)data;
    HalTaskGroup tasks = ctx->task_group;
    MppThread *thd = ctx->thd;
    Mpp *mpp = ctx->mpp;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppBufSlots slots = dec->frame_slots;

    HalTaskHnd task = NULL;
    HalTaskInfo task_info;
    HalDecVprocTask *task_vproc = &task_info.dec_vproc;

    mpp_dbg_info("mpp_dec_post_proc_thread started\n");

    while (1) {
        MPP_RET ret = MPP_OK;

        {
            AutoMutex autolock(thd->mutex());

            if (MPP_THREAD_RUNNING != thd->get_status())
                break;

            if (ctx->task_wait.val && !ctx->reset) {
                vproc_dbg_status("vproc thread wait %d", ctx->task_wait.val);
                thd->wait();
            }
        }

        if (!ctx->task_status.task_rdy) {
            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                if (ctx->reset) {
                    /* reset only on all task finished */
                    vproc_dbg_reset("reset start\n");

                    dec_vproc_clr_prev(ctx);

                    thd->lock(THREAD_CONTROL);
                    ctx->reset = 0;
                    thd->unlock(THREAD_CONTROL);
                    sem_post(&ctx->reset_sem);
                    ctx->task_wait.val = 0;

                    vproc_dbg_reset("reset done\n");
                    continue;
                }

                ctx->task_wait.task_in = 1;
                continue;
            }
            ctx->task_status.task_rdy = 1;
            ctx->task_wait.task_in = 0;
        }

        if (task) {
            ret = hal_task_hnd_get_info(task, &task_info);

            mpp_assert(ret == MPP_OK);

            RK_S32 index = task_vproc->input;
            RK_U32 eos = task_vproc->flags.eos;
            RK_U32 change = task_vproc->flags.info_change;
            MppFrame frm = NULL;

            if (eos && index < 0) {
                vproc_dbg_status("eos signal\n");

                mpp_frame_init(&frm);
                mpp_frame_set_eos(frm, eos);
                vproc_dbg_out("output at eos, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);
                mpp_frame_deinit(&frm);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }

            mpp_buf_slot_get_prop(slots, index, SLOT_FRAME_PTR, &frm);

            if (change) {
                vproc_dbg_status("info change\n");
                vproc_dbg_out("output at info change, frame poc %d\n", mpp_frame_get_poc(frm));
                dec_vproc_put_frame(mpp, frm, NULL, -1, 0);
                dec_vproc_clr_prev(ctx);

                if (ctx->com_ctx->ops->reset)
                    ctx->com_ctx->ops->reset(ctx->iep_ctx);

                hal_task_hnd_set_status(task, TASK_IDLE);
                ctx->task_status.task_rdy = 0;
                continue;
            }
            vproc_dbg_status("vproc get buf in");
            if (!ctx->task_status.buf_rdy && !ctx->reset) {
                MppBuffer buf = mpp_frame_get_buffer(frm);
                size_t buf_size = mpp_buffer_get_size(buf);
                if (!ctx->out_buf0) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf0, buf_size);
                    vproc_dbg_out("get out buf0 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf0));
                    if (NULL == ctx->out_buf0) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                if (!ctx->out_buf1) {
                    mpp_buffer_get(mpp->mFrameGroup, &ctx->out_buf1, buf_size);
                    vproc_dbg_out("get out buf1 ptr %p\n", mpp_buffer_get_ptr(ctx->out_buf1));
                    if (NULL == ctx->out_buf1) {
                        ctx->task_wait.task_buf_in = 1;
                        continue;
                    }
                }
                ctx->task_status.buf_rdy = 1;
            }

            RK_S32 tmp = -1;
            mpp_buf_slot_dequeue(slots, &tmp, QUEUE_DEINTERLACE);
            mpp_assert(tmp == index);

            vproc_dbg_status("vproc get buf ready & start process ");
            if (!ctx->reset && ctx->iep_ctx) {
                vproc_dbg_in("processing frame poc %d, mode 0x%x, err %x vs %x, buf slot %x, ptr %p\n",
                             mpp_frame_get_poc(frm), mpp_frame_get_mode(frm), mpp_frame_get_errinfo(frm),
                             mpp_frame_get_discard(frm), index, mpp_buffer_get_ptr(mpp_frame_get_buffer(frm)));
                ctx->set_dei((MppDecVprocCtx *)ctx, frm);
            }

            dec_vproc_update_ref(ctx, frm, index, eos);
            hal_task_hnd_set_status(task, TASK_IDLE);
            ctx->task_status.val = 0;
            ctx->task_wait.val = 0;

            vproc_dbg_status("vproc task done");
        }
    }
    mpp_dbg_info("mpp_dec_post_proc_thread exited\n");

    return NULL;
}